

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_bcc(m68k_info *info,int size,int displacement)

{
  build_relative_branch
            (info,*(int *)((long)s_branch_lut + (ulong)(info->ir >> 6 & 0x3c)),size,displacement);
  return;
}

Assistant:

static void build_bcc(m68k_info *info, int size, int displacement)
{
	build_relative_branch(info, s_branch_lut[(info->ir >> 8) & 0xf], size, displacement);
}